

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

void Cnf_DataCollectFlipLits(Cnf_Dat_t *p,int iFlipVar,Vec_Int_t *vFlips)

{
  long lVar1;
  
  if (p->pMan != (Aig_Man_t *)0x0) {
    __assert_fail("p->pMan == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfMan.c"
                  ,0xdd,"void Cnf_DataCollectFlipLits(Cnf_Dat_t *, int, Vec_Int_t *)");
  }
  vFlips->nSize = 0;
  if (0 < p->nLiterals) {
    lVar1 = 0;
    do {
      if ((*p->pClauses)[lVar1] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if ((uint)(*p->pClauses)[lVar1] >> 1 == iFlipVar) {
        Vec_IntPush(vFlips,(int)lVar1);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nLiterals);
  }
  return;
}

Assistant:

void Cnf_DataCollectFlipLits( Cnf_Dat_t * p, int iFlipVar, Vec_Int_t * vFlips )
{
    int v;
    assert( p->pMan == NULL );
    Vec_IntClear( vFlips );
    for ( v = 0; v < p->nLiterals; v++ )
        if ( Abc_Lit2Var(p->pClauses[0][v]) == iFlipVar )
            Vec_IntPush( vFlips, v );
}